

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_REMOVE_CURSE(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  wchar_t wVar2;
  char local_58 [8];
  char dice_string [20];
  object *local_38;
  object *obj;
  wchar_t strength;
  wchar_t itemmode;
  char *rejmsg;
  char *prompt;
  effect_handler_context_t_conflict *context_local;
  
  rejmsg = "Uncurse which item? ";
  _strength = "You have no curses to remove.";
  obj._4_4_ = L'\x0f';
  prompt = (char *)context;
  obj._0_4_ = effect_calculate_value(context,false);
  local_38 = (object *)0x0;
  prompt[0x60] = '\x01';
  if (*(long *)(prompt + 0x68) == 0) {
    _Var1 = get_item(&local_38,rejmsg,_strength,CMD_NULL,item_tester_uncursable,obj._4_4_);
    if (!_Var1) {
      return false;
    }
  }
  else {
    wVar2 = cmd_get_item(*(command **)(prompt + 0x68),"tgtitem",&local_38,rejmsg,_strength,
                         item_tester_uncursable,obj._4_4_);
    if (wVar2 != L'\0') {
      return false;
    }
  }
  if ((*(int *)(prompt + 0x34) == 1) && (*(int *)(prompt + 0x30) != 0)) {
    strnfmt(local_58,0x14,"%d+d%d",(ulong)*(uint *)(prompt + 0x30),(ulong)*(uint *)(prompt + 0x38));
  }
  else if ((*(int *)(prompt + 0x34) == 0) || (*(int *)(prompt + 0x30) == 0)) {
    if (*(int *)(prompt + 0x34) == 1) {
      strnfmt(local_58,0x14,"d%d",(ulong)*(uint *)(prompt + 0x38));
    }
    else if (*(int *)(prompt + 0x34) == 0) {
      strnfmt(local_58,0x14,"%d",(ulong)*(uint *)(prompt + 0x30));
    }
    else {
      strnfmt(local_58,0x14,"%dd%d",(ulong)*(uint *)(prompt + 0x34),(ulong)*(uint *)(prompt + 0x38))
      ;
    }
  }
  else {
    strnfmt(local_58,0x14,"%d+%dd%d",(ulong)*(uint *)(prompt + 0x30),(ulong)*(uint *)(prompt + 0x34)
            ,(ulong)*(uint *)(prompt + 0x38));
  }
  _Var1 = uncurse_object(local_38,(wchar_t)obj,local_58);
  return _Var1;
}

Assistant:

bool effect_handler_REMOVE_CURSE(effect_handler_context_t *context)
{
	const char *prompt = "Uncurse which item? ";
	const char *rejmsg = "You have no curses to remove.";
	int itemmode = (USE_EQUIP | USE_INVEN | USE_QUIVER | USE_FLOOR);
	int strength = effect_calculate_value(context, false);
	struct object *obj = NULL;
	char dice_string[20];

	context->ident = true;

	if (context->cmd) {
		if (cmd_get_item(context->cmd, "tgtitem", &obj, prompt,
				rejmsg, item_tester_uncursable, itemmode)) {
			return false;
		}
	} else if (!get_item(&obj, prompt, rejmsg, 0, item_tester_uncursable,
			itemmode))
		return false;

	/* Get the possible dice strings */
	if ((context->value.dice == 1) && context->value.base) {
		strnfmt(dice_string, sizeof(dice_string), "%d+d%d",
				context->value.base, context->value.sides);
	} else if (context->value.dice && context->value.base) {
		strnfmt(dice_string, sizeof(dice_string), "%d+%dd%d",
				context->value.base, context->value.dice, context->value.sides);
	} else if (context->value.dice == 1) {
		strnfmt(dice_string, sizeof(dice_string), "d%d", context->value.sides);
	} else if (context->value.dice) {
		strnfmt(dice_string, sizeof(dice_string), "%dd%d",
				context->value.dice, context->value.sides);
	} else {
		strnfmt(dice_string, sizeof(dice_string), "%d", context->value.base);
	}

	return uncurse_object(obj, strength, dice_string);
}